

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O0

_Bool plutovg_skip_ws_or_comma(char **begin,char *end,_Bool *has_comma)

{
  _Bool _Var1;
  _Bool *has_comma_local;
  char *end_local;
  char **begin_local;
  
  _Var1 = plutovg_skip_ws_or_delim(begin,end,',',has_comma);
  return _Var1;
}

Assistant:

static inline bool plutovg_skip_ws_or_comma(const char** begin, const char* end, bool* has_comma)
{
    return plutovg_skip_ws_or_delim(begin, end, ',', has_comma);
}